

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeferredTypeHandler.cpp
# Opt level: O0

DictionaryTypeHandler * __thiscall
Js::DeferredTypeHandlerBase::ConvertToDictionaryType
          (DeferredTypeHandlerBase *this,DynamicObject *instance,int initSlotCapacity,BOOL isProto)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  DictionaryTypeHandlerBase<unsigned_short> *pDVar4;
  ScriptContext *pSVar5;
  DictionaryTypeHandler *newTypeHandler;
  BOOL isProto_local;
  int initSlotCapacity_local;
  DynamicObject *instance_local;
  DeferredTypeHandlerBase *this_local;
  
  if (0xfffe < initSlotCapacity) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DeferredTypeHandler.cpp"
                                ,0x9f,
                                "(initSlotCapacity <= DictionaryTypeHandler::MaxPropertyIndexSize)",
                                "initSlotCapacity <= DictionaryTypeHandler::MaxPropertyIndexSize");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  pDVar4 = ConvertToTypeHandler<Js::DictionaryTypeHandlerBase<unsigned_short>>
                     (this,instance,initSlotCapacity,isProto);
  pSVar5 = RecyclableObject::GetScriptContext(&instance->super_RecyclableObject);
  pSVar5->convertDeferredToDictionaryCount = pSVar5->convertDeferredToDictionaryCount + 1;
  return pDVar4;
}

Assistant:

DictionaryTypeHandler* DeferredTypeHandlerBase::ConvertToDictionaryType(DynamicObject* instance, int initSlotCapacity, BOOL isProto)
    {
        // DeferredTypeHandler is only used internally by the type system. "initSlotCapacity" should be a tiny number.
        Assert(initSlotCapacity <= DictionaryTypeHandler::MaxPropertyIndexSize);

        DictionaryTypeHandler* newTypeHandler = ConvertToTypeHandler<DictionaryTypeHandler>(instance, initSlotCapacity, isProto);

    #ifdef PROFILE_TYPES
        instance->GetScriptContext()->convertDeferredToDictionaryCount++;
    #endif
        return newTypeHandler;
    }